

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O2

void __thiscall
argparse::ArgumentParser::parse_args_internal
          (ArgumentParser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *raw_arguments)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  iterator iVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  start;
  iterator iVar4;
  mapped_type_conflict *pmVar5;
  runtime_error *prVar6;
  char *pcVar7;
  _List_node_base *p_Var8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  ulong uVar9;
  string_view name;
  string_view prefix_chars;
  string_view input;
  allocator<char> local_121;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unprocessed_arguments;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  _List_node_base *local_d8;
  _List_node_base *local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  string_view maybe_command;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string_view local_40;
  
  preprocess_arguments(&arguments,this,raw_arguments);
  if (((this->m_program_name)._M_string_length == 0) &&
     (arguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      arguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&this->m_program_name,
               arguments.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  local_d8 = (_List_node_base *)&this->m_positional_arguments;
  p_Var1 = &(this->m_argument_map)._M_t._M_impl.super__Rb_tree_header;
  start._M_current =
       arguments.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start + 1;
  local_d0 = (this->m_positional_arguments).
             super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl.
             _M_node.super__List_node_base._M_next;
LAB_0011961c:
  do {
    __first._M_current = start._M_current;
    if (__first._M_current ==
        arguments.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this->m_is_parsed = true;
LAB_00119790:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&arguments);
      return;
    }
    name._M_str = ((__first._M_current)->_M_dataplus)._M_p;
    name._M_len = (__first._M_current)->_M_string_length;
    prefix_chars._M_str = (this->m_prefix_chars)._M_dataplus._M_p;
    prefix_chars._M_len = (this->m_prefix_chars)._M_string_length;
    bVar2 = Argument::is_positional(name,prefix_chars);
    if (bVar2) {
      if (local_d0 == local_d8) {
        maybe_command._M_str = ((__first._M_current)->_M_dataplus)._M_p;
        pcVar7 = (char *)(__first._M_current)->_M_string_length;
        maybe_command._M_len = (size_t)pcVar7;
        iVar4 = std::
                _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<std::reference_wrapper<argparse::ArgumentParser>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<std::reference_wrapper<argparse::ArgumentParser>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<std::reference_wrapper<argparse::ArgumentParser>_>_>_>_>
                ::find(&(this->m_subparser_map)._M_t,&maybe_command);
        if ((_Rb_tree_header *)iVar4._M_node ==
            &(this->m_subparser_map)._M_t._M_impl.super__Rb_tree_header) {
          if ((((_List_base<argparse::Argument,_std::allocator<argparse::Argument>_> *)
               &local_d8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next != local_d8) {
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(&local_f8,
                           "Maximum number of positional arguments exceeded, failed to parse \'",
                           __first._M_current);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &unprocessed_arguments,&local_f8,"\'");
            std::runtime_error::runtime_error(prVar6,(string *)&unprocessed_arguments);
            __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          if ((this->m_subparser_map)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(&local_80,"Failed to parse \'",__first._M_current);
            std::operator+(&local_60,&local_80,"\', did you mean \'");
            input._M_str = pcVar7;
            input._M_len = (size_t)((__first._M_current)->_M_dataplus)._M_p;
            local_40 = details::
                       get_most_similar_string<std::_List_iterator<std::reference_wrapper<argparse::ArgumentParser>>>
                                 ((details *)&this->m_subparser_map,
                                  (map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<std::reference_wrapper<argparse::ArgumentParser>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<std::reference_wrapper<argparse::ArgumentParser>_>_>_>_>
                                   *)(__first._M_current)->_M_string_length,input);
            std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                      ((string *)&local_a0,&local_40,&local_121);
            std::operator+(&local_f8,&local_60,&local_a0);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &unprocessed_arguments,&local_f8,"\'");
            std::runtime_error::runtime_error(prVar6,(string *)&unprocessed_arguments);
            __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          p_Var8 = (this->m_optional_arguments).
                   super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl
                   ._M_node.super__List_node_base._M_next;
          if (p_Var8 == (_List_node_base *)&this->m_optional_arguments) {
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar6,"Zero positional arguments expected");
          }
          else {
            for (; p_Var8 != (_List_node_base *)&this->m_optional_arguments;
                p_Var8 = p_Var8->_M_next) {
              if ((p_Var8[0xd]._M_next == (_List_node_base *)0x0) &&
                 (((ulong)p_Var8[0x15]._M_next & 0x10) == 0)) {
                prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                Argument::get_usage_full_abi_cxx11_(&local_f8,(Argument *)(p_Var8 + 1));
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &unprocessed_arguments,
                               "Zero positional arguments expected, did you mean ",&local_f8);
                std::runtime_error::runtime_error(prVar6,(string *)&unprocessed_arguments);
                __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
            }
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar6,"Zero positional arguments expected");
          }
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        vector<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &unprocessed_arguments,__first,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )arguments.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_f8);
        this->m_is_parsed = true;
        pmVar5 = std::
                 map<std::basic_string_view<char,_std::char_traits<char>_>,_bool,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_bool>_>_>
                 ::operator[](&this->m_subparser_used,&maybe_command);
        *pmVar5 = true;
        parse_args((ArgumentParser *)(iVar4._M_node[1]._M_left)->_M_left,&unprocessed_arguments);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&unprocessed_arguments);
        goto LAB_00119790;
      }
      p_Var8 = local_d0->_M_next;
      start = Argument::
              consume<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        ((Argument *)(local_d0 + 1),__first,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )arguments.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(string_view)ZEXT816(0));
      local_d0 = p_Var8;
      goto LAB_0011961c;
    }
    unprocessed_arguments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)((__first._M_current)->_M_dataplus)._M_p;
    unprocessed_arguments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(__first._M_current)->_M_string_length;
    iVar3 = std::
            _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
            ::find(&(this->m_argument_map)._M_t,(key_type *)&unprocessed_arguments);
    if ((_Rb_tree_header *)iVar3._M_node == p_Var1) {
      if ((((__first._M_current)->_M_string_length < 2) ||
          (bVar2 = is_valid_prefix_char(this,*((__first._M_current)->_M_dataplus)._M_p), !bVar2)) ||
         (bVar2 = is_valid_prefix_char(this,((__first._M_current)->_M_dataplus)._M_p[1]), bVar2)) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &unprocessed_arguments,"Unknown argument: ",__first._M_current);
        std::runtime_error::runtime_error(prVar6,(string *)&unprocessed_arguments);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      start._M_current = __first._M_current + 1;
      for (uVar9 = 1; uVar9 < (__first._M_current)->_M_string_length; uVar9 = uVar9 + 1) {
        unprocessed_arguments.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&unprocessed_arguments.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        unprocessed_arguments.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ =
             (ushort)(byte)((__first._M_current)->_M_dataplus)._M_p[uVar9] << 8 | 0x2d;
        unprocessed_arguments.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
        unprocessed_arguments.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
        local_f8._M_dataplus._M_p = (pointer)0x2;
        local_f8._M_string_length =
             (size_type)
             unprocessed_arguments.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        iVar3 = std::
                _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
                ::find(&(this->m_argument_map)._M_t,(key_type *)&local_f8);
        if ((_Rb_tree_header *)iVar3._M_node == p_Var1) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_f8,"Unknown argument: ",__first._M_current);
          std::runtime_error::runtime_error(prVar6,(string *)&local_f8);
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        start = Argument::
                consume<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          ((Argument *)&(iVar3._M_node[1]._M_left)->_M_left,start,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )arguments.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                           *(string_view *)(iVar3._M_node + 1));
        std::__cxx11::string::~string((string *)&unprocessed_arguments);
      }
    }
    else {
      start = Argument::
              consume<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        ((Argument *)&(iVar3._M_node[1]._M_left)->_M_left,__first._M_current + 1,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )arguments.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                         *(string_view *)(iVar3._M_node + 1));
    }
  } while( true );
}

Assistant:

void parse_args_internal(const std::vector<std::string> &raw_arguments) {
    auto arguments = preprocess_arguments(raw_arguments);
    if (m_program_name.empty() && !arguments.empty()) {
      m_program_name = arguments.front();
    }
    auto end = std::end(arguments);
    auto positional_argument_it = std::begin(m_positional_arguments);
    for (auto it = std::next(std::begin(arguments)); it != end;) {
      const auto &current_argument = *it;
      if (Argument::is_positional(current_argument, m_prefix_chars)) {
        if (positional_argument_it == std::end(m_positional_arguments)) {

          std::string_view maybe_command = current_argument;

          // Check sub-parsers
          auto subparser_it = m_subparser_map.find(maybe_command);
          if (subparser_it != m_subparser_map.end()) {

            // build list of remaining args
            const auto unprocessed_arguments =
                std::vector<std::string>(it, end);

            // invoke subparser
            m_is_parsed = true;
            m_subparser_used[maybe_command] = true;
            return subparser_it->second->get().parse_args(
                unprocessed_arguments);
          }

          if (m_positional_arguments.empty()) {

            // Ask the user if they argument they provided was a typo
            // for some sub-parser,
            // e.g., user provided `git totes` instead of `git notes`
            if (!m_subparser_map.empty()) {
              throw std::runtime_error(
                  "Failed to parse '" + current_argument + "', did you mean '" +
                  std::string{details::get_most_similar_string(
                      m_subparser_map, current_argument)} +
                  "'");
            }

            // Ask the user if they meant to use a specific optional argument
            if (!m_optional_arguments.empty()) {
              for (const auto &opt : m_optional_arguments) {
                if (!opt.m_implicit_value.has_value()) {
                  // not a flag, requires a value
                  if (!opt.m_is_used) {
                    throw std::runtime_error(
                        "Zero positional arguments expected, did you mean " +
                        opt.get_usage_full());
                  }
                }
              }

              throw std::runtime_error("Zero positional arguments expected");
            } else {
              throw std::runtime_error("Zero positional arguments expected");
            }
          } else {
            throw std::runtime_error("Maximum number of positional arguments "
                                     "exceeded, failed to parse '" +
                                     current_argument + "'");
          }
        }
        auto argument = positional_argument_it++;
        it = argument->consume(it, end);
        continue;
      }

      auto arg_map_it = m_argument_map.find(current_argument);
      if (arg_map_it != m_argument_map.end()) {
        auto argument = arg_map_it->second;
        it = argument->consume(std::next(it), end, arg_map_it->first);
      } else if (const auto &compound_arg = current_argument;
                 compound_arg.size() > 1 &&
                 is_valid_prefix_char(compound_arg[0]) &&
                 !is_valid_prefix_char(compound_arg[1])) {
        ++it;
        for (std::size_t j = 1; j < compound_arg.size(); j++) {
          auto hypothetical_arg = std::string{'-', compound_arg[j]};
          auto arg_map_it2 = m_argument_map.find(hypothetical_arg);
          if (arg_map_it2 != m_argument_map.end()) {
            auto argument = arg_map_it2->second;
            it = argument->consume(it, end, arg_map_it2->first);
          } else {
            throw std::runtime_error("Unknown argument: " + current_argument);
          }
        }
      } else {
        throw std::runtime_error("Unknown argument: " + current_argument);
      }
    }
    m_is_parsed = true;
  }